

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O3

string * __thiscall
duckdb::StringUtil::GenerateRandomName_abi_cxx11_
          (string *__return_storage_ptr__,StringUtil *this,idx_t length)

{
  uint64_t uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  RandomEngine engine;
  stringstream ss;
  char local_1e9;
  RandomEngine local_1e8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  RandomEngine::RandomEngine(&local_1e8,-1);
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (this != (StringUtil *)0x0) {
    do {
      uVar1 = RandomEngine::NextRandomInteger64(&local_1e8);
      auVar3._8_4_ = (int)(uVar1 >> 0x20);
      auVar3._0_8_ = uVar1;
      auVar3._12_4_ = 0x45300000;
      dVar2 = ldexp((auVar3._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0),-0x40);
      local_1e9 = "0123456789abcdef"[(long)(dVar2 * 15.0) & 0xffffffff];
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1e9,1);
      this = this + -1;
    } while (this != (StringUtil *)0x0);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  RandomEngine::~RandomEngine(&local_1e8);
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::GenerateRandomName(idx_t length) {
	RandomEngine engine;
	std::stringstream ss;
	for (idx_t i = 0; i < length; i++) {
		ss << "0123456789abcdef"[engine.NextRandomInteger(0, 15)];
	}
	return ss.str();
}